

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O2

void qt_scale_image_argb32_on_argb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int srch,QRectF *targetRect,
               QRectF *sourceRect,QRect *clip,int const_alpha)

{
  uchar *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [12];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int _i;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined4 uVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uchar *puVar26;
  ulong uVar27;
  long in_FS_OFFSET;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  ushort uVar34;
  int iVar35;
  ushort uVar41;
  int iVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar40;
  ushort uVar43;
  ushort uVar47;
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ushort uVar51;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  uchar *local_118;
  undefined4 uStack_ac;
  QRectF local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (const_alpha == 0x100) {
    auVar36._0_8_ = sourceRect->w;
    auVar36._8_8_ = sourceRect->h;
    auVar7 = *(undefined1 (*) [12])&targetRect->w;
    uStack_ac = (undefined4)((ulong)targetRect->h >> 0x20);
    QRectF::normalized();
    local_48 = QRectF::toRect(&local_68);
    auVar60 = QRect::operator&(&local_48,(QRect *)clip);
    iVar12 = auVar60._0_4_;
    iVar20 = auVar60._8_4_;
    uVar17 = (undefined4)CONCAT71((int7)((ulong)clip >> 8),iVar20 < iVar12);
    iVar21 = auVar60._4_4_;
    if (iVar21 <= auVar60._12_4_ && iVar20 >= iVar12) {
      auVar50._12_4_ = uStack_ac;
      auVar50._0_12_ = auVar7;
      auVar36 = divpd(auVar36,auVar50);
      dVar33 = auVar36._0_8_;
      dVar29 = auVar36._8_8_;
      if (0.0 <= dVar33) {
        iVar23 = -1;
        dVar28 = ceil((((double)iVar12 + 0.5) - targetRect->xp) * dVar33 * 65536.0);
        dVar32 = sourceRect->xp;
      }
      else {
        dVar28 = floor((((double)iVar12 + 0.5) - (targetRect->xp + targetRect->w)) * dVar33 *
                       65536.0);
        dVar32 = sourceRect->xp + sourceRect->w;
        iVar23 = 1;
      }
      iVar35 = (int)(dVar33 * 65536.0);
      iVar42 = (int)(dVar29 * 65536.0);
      iVar6 = (int)(long)(dVar32 * 65536.0);
      uVar14 = iVar6 + iVar23 + (int)dVar28;
      if (0.0 <= dVar29) {
        dVar29 = ceil((((double)iVar21 + 0.5) - targetRect->yp) * dVar29 * 65536.0);
        dVar33 = sourceRect->yp;
        iVar24 = -1;
      }
      else {
        iVar24 = 1;
        dVar29 = floor((((double)iVar21 + 0.5) - (targetRect->yp + targetRect->h)) * dVar29 *
                       65536.0);
        dVar33 = sourceRect->yp + sourceRect->h;
      }
      uVar10 = (int)(long)(dVar33 * 65536.0) + iVar24 + (int)dVar29;
      auVar30._4_4_ = iVar35;
      auVar30._0_4_ = iVar35;
      auVar30._8_4_ = iVar42;
      auVar30._12_4_ = iVar42;
      uVar17 = movmskpd(uVar17,auVar30);
      bVar19 = ((byte)uVar17 & 2) >> 1 & srch <= (int)(uVar10 >> 0x10);
      iVar24 = 0;
      if (bVar19 != 0) {
        iVar24 = iVar42;
      }
      uVar10 = iVar24 + uVar10;
      iVar11 = (auVar60._12_4_ - iVar21) - (uint)bVar19;
      bVar19 = sbpl >> 2 <= (int)(uVar14 >> 0x10) & (byte)uVar17;
      iVar24 = 0;
      if (bVar19 != 0) {
        iVar24 = iVar35;
      }
      iVar15 = uVar14 + iVar24;
      iVar25 = (iVar20 - iVar12) - (uint)bVar19;
      iVar20 = iVar11 + 1;
      if (srch <= (int)(iVar11 * iVar42 + uVar10 >> 0x10)) {
        iVar20 = iVar11;
      }
      iVar11 = iVar25 + 1;
      if (sbpl >> 2 <= (int)((uint)(iVar25 * iVar35 + iVar15) >> 0x10)) {
        iVar11 = iVar25;
      }
      local_118 = destPixels + (long)iVar12 * 4 + (long)(iVar21 * dbpl);
      puVar26 = destPixels + (long)(iVar21 * dbpl) + (long)iVar12 * 4;
      uVar18 = (ulong)iVar11;
      while( true ) {
        uVar16 = (ulong)((byte)-((byte)(((ulong)puVar26 & 0xffffffff) >> 2) & 0x3f) & 3);
        if (uVar18 < uVar16) {
          uVar16 = uVar18;
        }
        if (iVar20 < 1) break;
        uVar14 = iVar35 * (int)uVar16 + iVar23 + (int)dVar28 + iVar6 + iVar24;
        iVar20 = iVar20 + -1;
        uVar27 = (ulong)(-((uint)puVar26 >> 2) & 3);
        if (uVar18 < uVar27) {
          uVar27 = uVar18;
        }
        uVar8 = (uVar10 >> 0x10) * sbpl;
        iVar12 = iVar15;
        for (uVar22 = 0; uVar16 != uVar22; uVar22 = uVar22 + 1) {
          uVar13 = *(uint *)(srcPixels + (long)(iVar12 >> 0x10) * 4 + (ulong)uVar8);
          uVar9 = BYTE_MUL(*(uint *)(local_118 + uVar22 * 4),~uVar13 >> 0x18);
          *(uint *)(local_118 + uVar22 * 4) = uVar9 + uVar13;
          iVar12 = iVar12 + iVar35;
        }
        auVar60._4_4_ = iVar35 * 2 + iVar12;
        auVar60._0_4_ = iVar35 * 3 + iVar12;
        auVar60._12_4_ = iVar12;
        auVar60._8_4_ = iVar35 + iVar12;
        for (; (long)uVar27 < (long)(iVar11 + -3); uVar27 = uVar27 + 4) {
          uVar13 = *(uint *)(srcPixels + (ulong)auVar60._2_2_ * 4 + (ulong)uVar8);
          uVar3 = *(uint *)(srcPixels + (ulong)auVar60._6_2_ * 4 + (ulong)uVar8);
          uVar4 = *(uint *)(srcPixels + (ulong)auVar60._10_2_ * 4 + (ulong)uVar8);
          uVar5 = *(uint *)(srcPixels + (ulong)auVar60._14_2_ * 4 + (ulong)uVar8);
          auVar48._0_4_ = -(uint)(0x7effffff < (int)(uVar5 ^ 0x80000000));
          auVar48._4_4_ = -(uint)(0x7effffff < (int)(uVar4 ^ 0x80000000));
          auVar48._8_4_ = -(uint)(0x7effffff < (int)(uVar3 ^ 0x80000000));
          auVar48._12_4_ = -(uint)(0x7effffff < (int)(uVar13 ^ 0x80000000));
          iVar12 = movmskps((uint)auVar60._2_2_,auVar48);
          if (iVar12 == 0xf) {
            puVar2 = (uint *)(local_118 + uVar27 * 4);
            *puVar2 = uVar5;
            puVar2[1] = uVar4;
            puVar2[2] = uVar3;
            puVar2[3] = uVar13;
          }
          else {
            auVar37._0_4_ = -(uint)(-0x7f000001 < (int)(uVar5 ^ 0x80000000));
            auVar37._4_4_ = -(uint)(-0x7f000001 < (int)(uVar4 ^ 0x80000000));
            auVar37._8_4_ = -(uint)(-0x7f000001 < (int)(uVar3 ^ 0x80000000));
            auVar37._12_4_ = -(uint)(-0x7f000001 < (int)(uVar13 ^ 0x80000000));
            iVar12 = movmskps(iVar12,auVar37);
            if (iVar12 != 0) {
              auVar38._0_4_ = uVar5 >> 0x18;
              auVar38._4_4_ = uVar4 >> 0x18;
              auVar38._8_4_ = uVar3 >> 0x18;
              auVar38._12_4_ = uVar13 >> 0x18;
              auVar49._0_4_ = auVar38._0_4_ << 0x10;
              auVar49._4_4_ = auVar38._4_4_ << 0x10;
              auVar49._8_4_ = auVar38._8_4_ << 0x10;
              auVar49._12_4_ = auVar38._12_4_ << 0x10;
              auVar50 = (auVar49 | auVar38) ^ _DAT_0060d6f0;
              auVar36 = *(undefined1 (*) [16])(local_118 + uVar27 * 4);
              uVar51 = (auVar36._0_2_ >> 8) * auVar50._0_2_;
              uVar53 = (auVar36._2_2_ >> 8) * auVar50._2_2_;
              uVar54 = (auVar36._4_2_ >> 8) * auVar50._4_2_;
              uVar55 = (auVar36._6_2_ >> 8) * auVar50._6_2_;
              uVar56 = (auVar36._8_2_ >> 8) * auVar50._8_2_;
              uVar57 = (auVar36._10_2_ >> 8) * auVar50._10_2_;
              uVar58 = (auVar36._12_2_ >> 8) * auVar50._12_2_;
              uVar59 = (auVar36._14_2_ >> 8) * auVar50._14_2_;
              auVar36 = auVar36 & _DAT_0060d6f0;
              uVar34 = auVar36._0_2_ * auVar50._0_2_;
              uVar40 = auVar36._2_2_ * auVar50._2_2_;
              uVar41 = auVar36._4_2_ * auVar50._4_2_;
              uVar43 = auVar36._6_2_ * auVar50._6_2_;
              uVar44 = auVar36._8_2_ * auVar50._8_2_;
              uVar45 = auVar36._10_2_ * auVar50._10_2_;
              uVar46 = auVar36._12_2_ * auVar50._12_2_;
              uVar47 = auVar36._14_2_ * auVar50._14_2_;
              auVar52._0_2_ = uVar51 + 0x80 + (uVar51 >> 8);
              auVar52._2_2_ = uVar53 + 0x80 + (uVar53 >> 8);
              auVar52._4_2_ = uVar54 + 0x80 + (uVar54 >> 8);
              auVar52._6_2_ = uVar55 + 0x80 + (uVar55 >> 8);
              auVar52._8_2_ = uVar56 + 0x80 + (uVar56 >> 8);
              auVar52._10_2_ = uVar57 + 0x80 + (uVar57 >> 8);
              auVar52._12_2_ = uVar58 + 0x80 + (uVar58 >> 8);
              auVar52._14_2_ = uVar59 + 0x80 + (uVar59 >> 8);
              auVar39._0_2_ = (ushort)(uVar34 + 0x80 + (uVar34 >> 8)) >> 8;
              auVar39._2_2_ = (ushort)(uVar40 + 0x80 + (uVar40 >> 8)) >> 8;
              auVar39._4_2_ = (ushort)(uVar41 + 0x80 + (uVar41 >> 8)) >> 8;
              auVar39._6_2_ = (ushort)(uVar43 + 0x80 + (uVar43 >> 8)) >> 8;
              auVar39._8_2_ = (ushort)(uVar44 + 0x80 + (uVar44 >> 8)) >> 8;
              auVar39._10_2_ = (ushort)(uVar45 + 0x80 + (uVar45 >> 8)) >> 8;
              auVar39._12_2_ = (ushort)(uVar46 + 0x80 + (uVar46 >> 8)) >> 8;
              auVar39._14_2_ = (ushort)(uVar47 + 0x80 + (uVar47 >> 8)) >> 8;
              auVar39 = auVar39 | auVar52 & _DAT_0060d700;
              puVar1 = local_118 + uVar27 * 4;
              *puVar1 = auVar39[0] + (char)uVar5;
              puVar1[1] = auVar39[1] + (char)(uVar5 >> 8);
              puVar1[2] = auVar39[2] + (char)(uVar5 >> 0x10);
              puVar1[3] = auVar39[3] + (char)(uVar5 >> 0x18);
              puVar1[4] = auVar39[4] + (char)uVar4;
              puVar1[5] = auVar39[5] + (char)(uVar4 >> 8);
              puVar1[6] = auVar39[6] + (char)(uVar4 >> 0x10);
              puVar1[7] = auVar39[7] + (char)(uVar4 >> 0x18);
              puVar1[8] = auVar39[8] + (char)uVar3;
              puVar1[9] = auVar39[9] + (char)(uVar3 >> 8);
              puVar1[10] = auVar39[10] + (char)(uVar3 >> 0x10);
              puVar1[0xb] = auVar39[0xb] + (char)(uVar3 >> 0x18);
              puVar1[0xc] = auVar39[0xc] + (char)uVar13;
              puVar1[0xd] = auVar39[0xd] + (char)(uVar13 >> 8);
              puVar1[0xe] = auVar39[0xe] + (char)(uVar13 >> 0x10);
              puVar1[0xf] = auVar39[0xf] + (char)(uVar13 >> 0x18);
            }
          }
          auVar31._0_4_ = auVar60._0_4_ + iVar35 * 4;
          auVar31._4_4_ = auVar60._4_4_ + iVar35 * 4;
          auVar31._8_4_ = auVar60._8_4_ + iVar35 * 4;
          auVar31._12_4_ = auVar60._12_4_ + iVar35 * 4;
          uVar14 = uVar14 + iVar35 * 4;
          auVar60 = auVar31;
        }
        uVar13 = 0;
        for (; (uVar13 < 3 && ((long)uVar27 < (long)uVar18)); uVar27 = uVar27 + 1) {
          uVar3 = *(uint *)(srcPixels + (ulong)(uVar14 >> 0x10) * 4 + (ulong)uVar8);
          uVar9 = BYTE_MUL(*(uint *)(local_118 + uVar27 * 4),~uVar3 >> 0x18);
          *(uint *)(local_118 + uVar27 * 4) = uVar9 + uVar3;
          uVar13 = uVar13 + 1;
          uVar14 = uVar14 + iVar35;
        }
        local_118 = local_118 + dbpl;
        uVar10 = uVar10 + iVar42;
        puVar26 = puVar26 + dbpl;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qt_scale_image_argb32_on_argb32
              (destPixels,dbpl,srcPixels,sbpl,srch,targetRect,sourceRect,clip,const_alpha);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_scale_image_argb32_on_argb32_sse2(uchar *destPixels, int dbpl,
                                          const uchar *srcPixels, int sbpl, int srch,
                                          const QRectF &targetRect,
                                          const QRectF &sourceRect,
                                          const QRect &clip,
                                          int const_alpha)
{
    if (const_alpha != 256) {
        // from qblendfunctions.cpp
        extern void qt_scale_image_argb32_on_argb32(uchar *destPixels, int dbpl,
                                               const uchar *srcPixels, int sbpl, int srch,
                                               const QRectF &targetRect,
                                               const QRectF &sourceRect,
                                               const QRect &clip,
                                               int const_alpha);
        return qt_scale_image_argb32_on_argb32(destPixels, dbpl, srcPixels, sbpl, srch, targetRect, sourceRect, clip, const_alpha);
    }

    qreal sx = sourceRect.width() / (qreal)targetRect.width();
    qreal sy = sourceRect.height() / (qreal)targetRect.height();

    const int ix = 0x00010000 * sx;
    const int iy = 0x00010000 * sy;

    QRect tr = targetRect.normalized().toRect();
    tr = tr.intersected(clip);
    if (tr.isEmpty())
        return;
    const int tx1 = tr.left();
    const int ty1 = tr.top();
    int h = tr.height();
    int w = tr.width();

    quint32 basex;
    quint32 srcy;

    if (sx < 0) {
        int dstx = qFloor((tx1 + qreal(0.5) - targetRect.right()) * sx * 65536) + 1;
        basex = quint32(sourceRect.right() * 65536) + dstx;
    } else {
        int dstx = qCeil((tx1 + qreal(0.5) - targetRect.left()) * sx * 65536) - 1;
        basex = quint32(sourceRect.left() * 65536) + dstx;
    }
    if (sy < 0) {
        int dsty = qFloor((ty1 + qreal(0.5) - targetRect.bottom()) * sy * 65536) + 1;
        srcy = quint32(sourceRect.bottom() * 65536) + dsty;
    } else {
        int dsty = qCeil((ty1 + qreal(0.5) - targetRect.top()) * sy * 65536) - 1;
        srcy = quint32(sourceRect.top() * 65536) + dsty;
    }

    quint32 *dst = ((quint32 *) (destPixels + ty1 * dbpl)) + tx1;

    const __m128i nullVector = _mm_setzero_si128();
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i ixVector = _mm_set1_epi32(4*ix);

    // this bounds check here is required as floating point rounding above might in some cases lead to
    // w/h values that are one pixel too large, falling outside of the valid image area.
    const int ystart = srcy >> 16;
    if (ystart >= srch && iy < 0) {
        srcy += iy;
        --h;
    }
    const int xstart = basex >> 16;
    if (xstart >=  (int)(sbpl/sizeof(quint32)) && ix < 0) {
        basex += ix;
        --w;
    }
    int yend = (srcy + iy * (h - 1)) >> 16;
    if (yend < 0 || yend >= srch)
        --h;
    int xend = (basex + ix * (w - 1)) >> 16;
    if (xend < 0 || xend >= (int)(sbpl/sizeof(quint32)))
        --w;

    while (--h >= 0) {
        const uint *src = (const quint32 *) (srcPixels + (srcy >> 16) * sbpl);
        int srcx = basex;
        int x = 0;

        ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
            uint s = src[srcx >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
            srcx += ix;
        }

        __m128i srcxVector = _mm_set_epi32(srcx, srcx + ix, srcx + ix + ix, srcx + ix + ix + ix);

        for (; x < (w - 3); x += 4) {
            const int idx0 = _mm_extract_epi16(srcxVector, 1);
            const int idx1 = _mm_extract_epi16(srcxVector, 3);
            const int idx2 = _mm_extract_epi16(srcxVector, 5);
            const int idx3 = _mm_extract_epi16(srcxVector, 7);
            srcxVector = _mm_add_epi32(srcxVector, ixVector);

            const __m128i srcVector = _mm_set_epi32(src[idx0], src[idx1], src[idx2], src[idx3]);
            BLEND_SOURCE_OVER_ARGB32_SSE2_helper(dst, srcVector, nullVector, half, one, colorMask, alphaMask);
        }

        SIMD_EPILOGUE(x, w, 3) {
            uint s = src[(basex + x*ix) >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
        }
        dst = (quint32 *)(((uchar *) dst) + dbpl);
        srcy += iy;
    }
}